

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::ValueNumberDst(GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val)

{
  BVSparse<Memory::JitArenaAllocator> **this_00;
  OpCode OVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  undefined2 uVar3;
  BVIndex i;
  ObjectSymInfo *pOVar4;
  BasicBlock *pBVar5;
  ValueInfo *valueInfo;
  Sym *pSVar6;
  code *pcVar7;
  bool bVar8;
  OpndKind OVar9;
  BOOLEAN BVar10;
  bool bVar11;
  ValueType VVar12;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar13;
  uint uVar14;
  undefined4 *puVar15;
  IntConstantBounds IVar16;
  ValueType *pVVar17;
  StackSym *pSVar18;
  ProfiledInstr *pPVar19;
  RegOpnd *pRVar20;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  IndirOpnd *pIVar21;
  SymOpnd *symOpnd;
  Value *pVVar22;
  Instr *pIVar23;
  GlobOpt *this_03;
  PropertySym *pPVar24;
  BailOutKind bailOutKind;
  char *this_04;
  GlobOpt *this_05;
  Opnd *pOVar25;
  GlobOpt *pGVar26;
  GlobOpt *this_06;
  BVSparse<Memory::JitArenaAllocator> **ppBVar27;
  Type pJVar28;
  uint local_74;
  undefined4 *local_70;
  int local_64;
  int local_60;
  int32 min2;
  int32 max2;
  int32 max1;
  uint local_4c;
  Value *pVStack_48;
  int32 min1;
  undefined1 local_40 [8];
  ValueType profiledValueType;
  
  this_06 = (GlobOpt *)(*pInstr)->m_dst;
  bVar8 = IR::Instr::CallsSetter(*pInstr);
  if (this_06 == (GlobOpt *)0x0 || bVar8) {
    return (Value *)0x0;
  }
  OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
  _profiledValueType = this_06;
  if (OVar9 == OpndKindReg) {
    OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
    if (OVar9 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_0044f0ec;
      *puVar15 = 0;
      this_06 = _profiledValueType;
    }
    pJVar28 = (Type)this_06->intConstantToStackSymMap;
    _profiledValueType = this;
    bVar8 = OpCodeAttr::TempNumberProducing((*pInstr)->m_opcode);
    if (bVar8) {
      this_04 = (char *)(_profiledValueType->currentBlock->globOptData).isTempSrc;
      BVSparse<Memory::JitArenaAllocator>::Set
                ((BVSparse<Memory::JitArenaAllocator> *)this_04,
                 *(BVIndex *)
                  &(pJVar28->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData.bigBlocks);
    }
    else {
      bVar8 = OpCodeAttr::TempNumberTransfer((*pInstr)->m_opcode);
      if (bVar8) {
        pOVar25 = (*pInstr)->m_src1;
        pVStack_48 = src1Val;
        OVar9 = IR::Opnd::GetKind(pOVar25);
        if (OVar9 == OpndKindReg) {
          _max2 = (_profiledValueType->currentBlock->globOptData).isTempSrc;
          OVar9 = IR::Opnd::GetKind(pOVar25);
          if (OVar9 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            local_70 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *local_70 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar8) goto LAB_0044f0ec;
            *local_70 = 0;
          }
          BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                             (_max2,*(BVIndex *)(pOVar25[1]._vptr_Opnd + 2));
          if (BVar10 != '\0') {
            pRVar20 = IR::Opnd::AsRegOpnd(pOVar25);
            pIVar23 = (pRVar20->m_sym->field_5).m_instrDef;
            if ((((pIVar23 != (Instr *)0x0 & pRVar20->m_sym->field_0x18) == 1) &&
                (OVar1 = pIVar23->m_opcode, OVar1 != Add_A)) &&
               (bVar8 = OpCodeAttr::TempNumberProducing(OVar1), bVar8)) {
              this_04 = (char *)(_profiledValueType->currentBlock->globOptData).isTempSrc;
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)this_04,
                         *(BVIndex *)
                          &(pJVar28->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           super_ArenaData.bigBlocks);
              src1Val = pVStack_48;
              goto LAB_0044dc97;
            }
            _max2 = (_profiledValueType->currentBlock->globOptData).isTempSrc;
            pRVar20 = IR::Opnd::AsRegOpnd(pOVar25);
            BVSparse<Memory::JitArenaAllocator>::Clear(_max2,(pRVar20->m_sym->super_Sym).m_id);
          }
        }
        this_04 = (char *)(_profiledValueType->currentBlock->globOptData).isTempSrc;
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((BVSparse<Memory::JitArenaAllocator> *)this_04,
                   *(BVIndex *)
                    &(pJVar28->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.bigBlocks);
        src1Val = pVStack_48;
      }
      else {
        this_04 = (char *)(_profiledValueType->currentBlock->globOptData).isTempSrc;
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((BVSparse<Memory::JitArenaAllocator> *)this_04,
                   *(BVIndex *)
                    &(pJVar28->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.bigBlocks);
      }
    }
  }
  else {
    if (OVar9 != OpndKindSym) {
      return (Value *)0x0;
    }
    this_04 = (char *)this_06;
    OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
    if (OVar9 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      this_04 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar8) goto LAB_0044f0ec;
      *puVar15 = 0;
    }
    pJVar28 = (Type)_profiledValueType->intConstantToStackSymMap;
    this_06 = _profiledValueType;
    _profiledValueType = this;
  }
LAB_0044dc97:
  pGVar26 = _profiledValueType;
  if (src1Val == (Value *)0x0) {
    this_05 = (GlobOpt *)0x0;
  }
  else {
    this_05 = (GlobOpt *)src1Val->valueInfo;
  }
  if (src2Val == (Value *)0x0) {
    this_03 = (GlobOpt *)0x0;
  }
  else {
    this_03 = (GlobOpt *)src2Val->valueInfo;
  }
  pIVar23 = *pInstr;
  OVar1 = pIVar23->m_opcode;
  pVStack_48 = src1Val;
  if (StLocalSlot < OVar1) {
    if (OVar1 < Ld_I4) {
      if (NewRegEx < OVar1) {
        if (OVar1 < InitComputedProperty) {
          if (OVar1 == IsInst) {
switchD_0044dce2_caseD_3b:
            pVVar17 = &ValueType::Boolean;
            goto LAB_0044e18f;
          }
          if (OVar1 == BrOnEmpty) goto switchD_0044de90_caseD_220;
          if (OVar1 == Conv_Str) goto switchD_0044de90_caseD_228;
        }
        else {
          if (OVar1 - 0x1cf < 4) goto switchD_0044dce2_caseD_3b;
          if (OVar1 == InitComputedProperty) goto switchD_0044dce2_caseD_70;
        }
        goto switchD_0044dce2_caseD_28;
      }
      switch(OVar1) {
      case LdElemI_A:
        pVVar22 = ValueNumberLdElemDst(_profiledValueType,pInstr,src1Val);
        pIVar21 = IR::Opnd::AsIndirOpnd((*pInstr)->m_src1);
        local_40._0_2_ = (pIVar21->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar8 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar8) {
          return pVVar22;
        }
        pIVar23 = *pInstr;
        if (pIVar23->m_dst->m_type != TyVar) {
          return pVVar22;
        }
        goto LAB_0044e794;
      case ProfiledLdElemI_A:
      case ProfiledStElemI_A:
        break;
      case LdMethodElem:
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetObject(Object);
        local_40._0_2_ = aVar2.field_0;
        VVar12 = ValueType::ToLikely((ValueType *)local_40);
        pVVar22 = NewGenericValue(_profiledValueType,VVar12,(Opnd *)this_06);
        pIVar21 = IR::Opnd::AsIndirOpnd((*pInstr)->m_src1);
        local_40._0_2_ = (pIVar21->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar8 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar8) {
          return pVVar22;
        }
        pIVar23 = *pInstr;
LAB_0044e794:
        if ((pIVar23->field_0x38 & 0x10) == 0) {
          return pVVar22;
        }
        BVar13 = IR::Instr::GetBailOutKind(pIVar23);
        bailOutKind = BVar13 - BailOutOnArrayAccessHelperCall;
        if ((BVar13 >> 0x11 & 1) == 0) {
          bailOutKind = BVar13;
        }
        if ((bailOutKind != BailOutInvalid) && (bailOutKind != BailOutOnImplicitCallsPreOp)) {
          IR::Instr::SetBailOutKind(*pInstr,bailOutKind);
          return pVVar22;
        }
        IR::Instr::ClearBailOutInfo(*pInstr);
        return pVVar22;
      case StElemI_A:
      case StElemI_A_Strict:
        if (_profiledValueType->prePassLoop == (Loop *)0x0) goto switchD_0044dde9_caseD_1e5;
        goto LAB_0044ed02;
      default:
        switch(OVar1) {
        case LdLen_A:
          if (pIVar23->m_kind == InstrKindProfiled) {
            pPVar19 = IR::Instr::AsProfiledInstr(pIVar23);
            local_40._0_2_ = (pPVar19->u).field_3.fldInfoData.f1;
            bVar8 = ValueType::IsLikelyInt((ValueType *)local_40);
            if ((!bVar8) ||
               (pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06),
               (pRVar20->m_sym->field_0x18 & 2) == 0)) {
              aVar2.bits = (Type)local_40._0_4_;
              pGVar26 = _profiledValueType;
              goto LAB_0044ed3b;
            }
          }
          break;
        case ProfiledLdLen_A:
        case LdNaN:
        case LdInfinity:
        case LdTrue_ReuseLoc:
          break;
        case LdUndef:
          pVVar17 = &ValueType::Undefined;
          goto LAB_0044e18f;
        case LdTrue:
        case LdFalse:
          goto switchD_0044dce2_caseD_3b;
        default:
          if (OVar1 == LdThis) {
            this_01 = JITTimeWorkItem::GetJITFunctionBody(_profiledValueType->func->m_workItem);
            sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
            this_02 = JITTimeWorkItem::GetJITTimeInfo(pGVar26->func->m_workItem);
            functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
            bVar8 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015a4e90,OptTagChecksPhase,sourceContextId,functionId)
            ;
            if ((!bVar8) &&
               ((this_05 == (GlobOpt *)0x0 ||
                (bVar8 = ValueType::IsUninitialized
                                   ((ValueType *)&this_05->byteCodeConstantValueNumbersBv), bVar8)))
               ) {
              VVar12 = ValueType::GetObject(Object);
              local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
              local_40._0_2_ = ValueType::ToLikely((ValueType *)&local_4c);
              bVar8 = false;
              goto LAB_0044e9c4;
            }
          }
        }
      }
      goto switchD_0044dce2_caseD_28;
    }
    if (OVar1 < InitLocalClosure) {
      switch(OVar1) {
      case Ld_I4:
      case LdAsmJsFunc:
        goto switchD_0044dce2_caseD_45;
      case LdC_A_I4:
      case LdC_A_R8:
      case ArgIn_A:
        goto switchD_0044dde9_caseD_1e5;
      default:
        goto switchD_0044dce2_caseD_28;
      case LdMethodFromFlags:
      case LdSlotArr:
        goto switchD_0044dce2_caseD_5e;
      case StSlot:
      case StSlotChkUndecl:
        goto switchD_0044dce2_caseD_70;
      }
    }
    if (BailOnTaggedValue < OVar1) {
      if (OVar1 == BytecodeArgOutCapture) goto switchD_0044dce2_caseD_45;
      if (OVar1 == CheckFixedFld) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x12fd,"(false)",
                           "CheckFixedFld doesn\'t have a dst, so we should never get here");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      else if ((OVar1 == ExtendArg_A) && (bVar8 = DoCSE(_profiledValueType), bVar8)) {
        pBVar5 = _profiledValueType->currentBlock;
        pSVar18 = IR::Opnd::GetStackSym((*pInstr)->m_dst);
        pVVar22 = GlobOptBlockData::FindValue(&pBVar5->globOptData,&pSVar18->super_Sym);
        if (pVVar22 != (Value *)0x0) {
          return pVVar22;
        }
      }
      goto switchD_0044dce2_caseD_28;
    }
    switch(OVar1) {
    case InitLocalClosure:
      pOVar25 = pIVar23->m_dst;
      if (pOVar25 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14be,"(instr->GetDst())","instr->GetDst()");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
        pOVar25 = (*pInstr)->m_dst;
      }
      OVar9 = IR::Opnd::GetKind(pOVar25);
      if (OVar9 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14bf,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
      pSVar18 = pRVar20->m_sym;
      if (pSVar18 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14c2,"(opndStackSym != nullptr)","opndStackSym != nullptr");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      pOVar4 = pSVar18->m_objectInfo;
      if (pOVar4 == (ObjectSymInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x14c4,"(objectSymInfo != nullptr)","objectSymInfo != nullptr");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      for (pPVar24 = pOVar4->m_propertySymList; pPVar24 != (PropertySym *)0x0;
          pPVar24 = pPVar24->m_nextInStackSymList) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (_profiledValueType->slotSyms,(pPVar24->super_Sym).m_id);
      }
      break;
    case BrOnNotEmpty:
switchD_0044de90_caseD_220:
      OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
      pGVar26 = _profiledValueType;
      if (OVar9 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1497,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      local_40._0_2_ = *(undefined2 *)&this_06->byteCodeConstantValueNumbersBv;
      bVar8 = ValueType::IsString((ValueType *)local_40);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1498,"(dst->GetValueType().IsString())",
                           "dst->GetValueType().IsString()");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      aVar2.bits = String;
      goto LAB_0044ed3b;
    case LdStr:
      if (src1Val != (Value *)0x0) goto LAB_0044ed15;
      src1Val = NewGenericValue(_profiledValueType,(ValueType)0x800,(Opnd *)this_06);
      goto LAB_0044ed10;
    case Coerce_Str:
switchD_0044de90_caseD_228:
      local_40._0_2_ = (pIVar23->m_dst->m_valueType).field_0.bits;
      bVar8 = ValueType::IsString((ValueType *)local_40);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x12a2,"(instr->GetDst()->GetValueType().IsString())",
                           "Creator of this instruction should have set the type");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      if ((((*pInstr)->m_src2 != (Opnd *)0x0) && (this_05 != (GlobOpt *)0x0)) &&
         ((_profiledValueType->prePassLoop == (Loop *)0x0 &&
          (bVar8 = ValueType::IsString((ValueType *)&this_05->byteCodeConstantValueNumbersBv), bVar8
          )))) {
        IR::Instr::FreeSrc2(*pInstr);
      }
    case Coerce_StrOrRegex:
      if (((this_05 != (GlobOpt *)0x0) && (_profiledValueType->prePassLoop == (Loop *)0x0)) &&
         (bVar8 = ValueType::IsString((ValueType *)&this_05->byteCodeConstantValueNumbersBv), bVar8)
         ) {
        pIVar23 = *pInstr;
        pIVar23->m_opcode = Ld_A;
switchD_0044dce2_caseD_45:
        if ((_profiledValueType->prePassLoop == (Loop *)0x0) &&
           (OVar9 = IR::Opnd::GetKind(pIVar23->m_src1), OVar9 == OpndKindReg)) {
          pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06);
          if (((pRVar20->m_sym->field_0x18 & 1) != 0) &&
             ((pRVar20->m_sym->field_5).m_instrDef != (Instr *)0x0)) {
            pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06);
            pSVar18 = pRVar20->m_sym;
            pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
            StackSym::CopySymAttrs(pSVar18,pRVar20->m_sym);
          }
        }
        if ((*pInstr)->m_kind == InstrKindProfiled) {
          pPVar19 = IR::Instr::AsProfiledInstr(*pInstr);
          local_40._0_2_ = (pPVar19->u).field_3.fldInfoData.f1;
          bVar8 = ValueType::IsLikelyInt((ValueType *)local_40);
          pGVar26 = _profiledValueType;
          if ((!bVar8) ||
             (((OVar9 = IR::Opnd::GetKind((Opnd *)this_06), OVar9 != OpndKindReg ||
               (pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06),
               (pRVar20->m_sym->field_0x18 & 2) == 0)) &&
              ((OVar9 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar9 != OpndKindReg ||
               (pRVar20 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1),
               (pRVar20->m_sym->field_0x18 & 2) == 0)))))) {
            if (this_05 == (GlobOpt *)0x0) {
LAB_0044ecda:
              src1Val = NewGenericValue(pGVar26,(ValueType)local_40._0_2_,(Opnd *)this_06);
              if (src1Val != (Value *)0x0) goto LAB_0044ed15;
            }
            else {
              bVar8 = ValueType::IsUninitialized
                                ((ValueType *)&this_05->byteCodeConstantValueNumbersBv);
              if (bVar8) {
                if (pGVar26->prePassLoop != (Loop *)0x0) goto LAB_0044ecda;
                *(undefined2 *)&this_05->byteCodeConstantValueNumbersBv = local_40._0_2_;
                IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_40._0_2_);
              }
            }
          }
        }
LAB_0044eced:
        if (_profiledValueType->prePassLoop == (Loop *)0x0) {
switchD_0044dde9_caseD_1e5:
          src1Val = pVStack_48;
        }
        else {
          pIVar23 = *pInstr;
          src1Val = pVStack_48;
          pGVar26 = _profiledValueType;
LAB_0044ed02:
          src1Val = ValueNumberTransferDstInPrepass(pGVar26,pIVar23,src1Val);
        }
LAB_0044ed10:
        if (src1Val != (Value *)0x0) {
LAB_0044ed15:
          pVVar22 = GlobOptBlockData::SetValue
                              (&_profiledValueType->currentBlock->globOptData,src1Val,
                               (Opnd *)this_06);
          return pVVar22;
        }
      }
      break;
    case Conv_PrimStr:
      local_40._0_2_ = (pIVar23->m_dst->m_valueType).field_0.bits;
      bVar8 = ValueType::IsString((ValueType *)local_40);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1296,"(instr->GetDst()->GetValueType().IsString())",
                           "Creator of this instruction should have set the type");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      if (((this_05 != (GlobOpt *)0x0) && (_profiledValueType->prePassLoop == (Loop *)0x0)) &&
         (bVar8 = ValueType::IsPrimitive((ValueType *)&this_05->byteCodeConstantValueNumbersBv),
         bVar8)) {
        pIVar23 = *pInstr;
        pIVar23->m_opcode = Conv_Str;
        goto switchD_0044de90_caseD_228;
      }
    }
    goto switchD_0044dce2_caseD_28;
  }
  switch(OVar1) {
  case Incr_A:
  case Decr_A:
    ValueType::ValueType((ValueType *)local_40);
    pVVar22 = pVStack_48;
    if (pVStack_48 == (Value *)0x0) {
      local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x208;
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
      pIVar23 = *pInstr;
      pVVar22 = (Value *)0x0;
      pGVar26 = _profiledValueType;
    }
    else {
      local_40._0_2_ = ValueType::ToDefiniteAnyNumber(&pVStack_48->valueInfo->super_ValueType);
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
      pIVar23 = *pInstr;
      pGVar26 = _profiledValueType;
    }
    goto LAB_0044efc0;
  case Not_A:
    if ((src1Val == (Value *)0x0) ||
       (bVar8 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)this_05,(int *)&local_4c,&min2,
                           (bool)((byte)(*(uint *)&_profiledValueType->field_0xf4 >> 9) & 1)),
       !bVar8)) {
      local_4c = 0x80000000;
      min2 = 0x7fffffff;
      uVar14 = 0x7fffffff;
      local_74 = 0x80000000;
    }
    else {
      uVar14 = ~local_4c;
      local_74 = ~min2;
    }
    local_40._0_4_ = local_74;
    if ((int)uVar14 < (int)local_74) {
      local_40._0_4_ = uVar14;
    }
    if ((int)local_74 < (int)uVar14) {
      local_74 = uVar14;
    }
    pIVar23 = *pInstr;
    goto LAB_0044e63c;
  case Typeof:
  case TypeofElem:
    pVVar17 = &ValueType::String;
    goto LAB_0044e18f;
  case Add_A:
    ValueType::ValueType((ValueType *)local_40);
    if (pVStack_48 == (Value *)0x0) {
LAB_0044ed92:
      if ((src2Val == (Value *)0x0) ||
         (bVar8 = ValueType::IsString((ValueType *)&this_03->byteCodeConstantValueNumbersBv), !bVar8
         )) {
        pGVar26 = _profiledValueType;
        if (pVStack_48 == (Value *)0x0) {
LAB_0044ef23:
          if ((src2Val == (Value *)0x0) ||
             (bVar8 = ValueType::IsLikelyString
                                ((ValueType *)&this_03->byteCodeConstantValueNumbersBv), !bVar8)) {
            bVar8 = ValueType::IsUninitialized((ValueType *)local_40);
            pVVar22 = pVStack_48;
            if (!bVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar15 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x1403,"(valueType.IsUninitialized())",
                                 "valueType.IsUninitialized()");
              if (!bVar8) goto LAB_0044f0ec;
              *puVar15 = 0;
              pVVar22 = pVStack_48;
            }
            goto LAB_0044efb3;
          }
        }
        else {
          ppBVar27 = &this_05->byteCodeConstantValueNumbersBv;
          bVar8 = ValueType::IsNotString((ValueType *)ppBVar27);
          if ((bVar8) &&
             (_profiledValueType = pGVar26, bVar8 = ValueType::IsPrimitive((ValueType *)ppBVar27),
             pGVar26 = _profiledValueType, bVar8 && src2Val != (Value *)0x0)) {
            _max2 = (BVSparse<Memory::JitArenaAllocator> *)&this_03->byteCodeConstantValueNumbersBv;
            bVar8 = ValueType::IsNotString((ValueType *)_max2);
            if ((bVar8) && (bVar8 = ValueType::IsPrimitive((ValueType *)_max2), bVar8)) {
              aVar2.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetCanBeTaggedValue(&ValueType::Number,true);
              goto LAB_0044ef44;
            }
          }
          bVar8 = ValueType::IsLikelyString((ValueType *)ppBVar27);
          if (!bVar8) goto LAB_0044ef23;
        }
        pVVar17 = &ValueType::String;
LAB_0044ef3f:
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely(pVVar17);
        goto LAB_0044ef44;
      }
LAB_0044eda4:
      local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x800;
      pVVar22 = pVStack_48;
      pGVar26 = _profiledValueType;
    }
    else {
      _max2 = (BVSparse<Memory::JitArenaAllocator> *)&this_05->byteCodeConstantValueNumbersBv;
      bVar8 = ValueType::IsLikelyNumber((ValueType *)_max2);
      if (!bVar8 || src2Val == (Value *)0x0) {
LAB_0044ed85:
        bVar8 = ValueType::IsString((ValueType *)_max2);
        if (!bVar8) goto LAB_0044ed92;
        goto LAB_0044eda4;
      }
      ppBVar27 = &this_03->byteCodeConstantValueNumbersBv;
      bVar8 = ValueType::IsLikelyNumber((ValueType *)ppBVar27);
      if (!bVar8) goto LAB_0044ed85;
      bVar8 = ValueType::IsLikelyInt((ValueType *)_max2);
      if ((!bVar8) || (bVar8 = ValueType::IsLikelyInt((ValueType *)ppBVar27), !bVar8)) {
        bVar8 = ValueType::IsNumber((ValueType *)_max2);
        pGVar26 = _profiledValueType;
        pVVar22 = pVStack_48;
        if ((bVar8) && (bVar8 = ValueType::IsNumber((ValueType *)ppBVar27), bVar8)) {
          bVar8 = ValueType::IsFloat((ValueType *)_max2);
          if ((bVar8) || (bVar8 = ValueType::IsFloat((ValueType *)ppBVar27), bVar8)) {
            pVVar17 = &ValueType::Float;
          }
          else {
            pVVar17 = &ValueType::Number;
          }
          local_40._0_2_ = ValueType::SetCanBeTaggedValue(pVVar17,true);
        }
        else {
          bVar8 = ValueType::IsLikelyFloat((ValueType *)_max2);
          if ((bVar8) || (bVar8 = ValueType::IsLikelyFloat((ValueType *)ppBVar27), bVar8)) {
            pVVar17 = &ValueType::Float;
          }
          else {
            pVVar17 = &ValueType::Number;
          }
          local_40._0_2_ = ValueType::ToLikely(pVVar17);
        }
        goto LAB_0044efb3;
      }
      bVar8 = ValueType::IsLikelyTaggedInt((ValueType *)_max2);
      pGVar26 = _profiledValueType;
      if (bVar8) {
        bVar8 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar27);
      }
      else {
        bVar8 = false;
      }
      bVar11 = ValueType::IsNumber((ValueType *)_max2);
      if ((!bVar11) || (bVar11 = ValueType::IsNumber((ValueType *)ppBVar27), !bVar11)) {
        VVar12 = ValueType::GetInt(bVar8);
        pVVar17 = (ValueType *)&local_4c;
        local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
        goto LAB_0044ef3f;
      }
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetNumberAndLikelyInt(bVar8);
LAB_0044ef44:
      local_40._0_2_ = aVar2.bits;
      pVVar22 = pVStack_48;
    }
LAB_0044efb3:
    pIVar23 = *pInstr;
    aVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13)local_40._0_2_;
    goto LAB_0044efc0;
  case Div_A:
    VVar12 = GetDivValueType(_profiledValueType,pIVar23,src1Val,src2Val,false);
    local_40._0_2_ = VVar12.field_0;
    bVar8 = ValueType::IsLikelyInt((ValueType *)local_40);
    if ((!bVar8) && (bVar8 = ValueType::IsFloat((ValueType *)local_40), !bVar8))
    goto switchD_0044dce2_caseD_30;
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
    goto LAB_0044eecc;
  case Mul_A:
  case Rem_A:
  case Sub_A:
switchD_0044dce2_caseD_30:
    ValueType::ValueType((ValueType *)local_40);
    if (pVStack_48 == (Value *)0x0) {
LAB_0044ee95:
      if ((src2Val != (Value *)0x0) &&
         (bVar8 = ValueType::IsLikelyFloat((ValueType *)&this_03->byteCodeConstantValueNumbersBv),
         bVar8)) goto LAB_0044eeaa;
      pVVar17 = &ValueType::Number;
    }
    else {
      ppBVar27 = &this_05->byteCodeConstantValueNumbersBv;
      bVar8 = ValueType::IsLikelyInt((ValueType *)ppBVar27);
      if (bVar8 && src2Val != (Value *)0x0) {
        this_00 = &this_03->byteCodeConstantValueNumbersBv;
        bVar8 = ValueType::IsLikelyInt((ValueType *)this_00);
        if ((bVar8) && ((*pInstr)->m_opcode != Div_A)) {
          bVar8 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar27);
          _max2 = (BVSparse<Memory::JitArenaAllocator> *)this_00;
          if (bVar8) {
            bVar11 = ValueType::IsLikelyTaggedInt((ValueType *)this_00);
            bVar8 = true;
            if (!bVar11) {
              bVar8 = (*pInstr)->m_opcode == Rem_A;
            }
          }
          else {
            bVar8 = false;
          }
          pGVar26 = _profiledValueType;
          bVar11 = ValueType::IsNumber((ValueType *)ppBVar27);
          if ((bVar11) && (bVar11 = ValueType::IsNumber((ValueType *)_max2), bVar11)) {
            aVar2.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::GetNumberAndLikelyInt(bVar8);
          }
          else {
            VVar12 = ValueType::GetInt(bVar8);
            local_4c = CONCAT22(local_4c._2_2_,VVar12.field_0);
            aVar2.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::ToLikely((ValueType *)&local_4c);
          }
          local_40._0_2_ = aVar2.bits;
          goto LAB_0044eecc;
        }
      }
      bVar8 = ValueType::IsLikelyFloat((ValueType *)ppBVar27);
      if (!bVar8) goto LAB_0044ee95;
LAB_0044eeaa:
      pVVar17 = &ValueType::Float;
    }
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue(pVVar17,true);
    local_40._0_2_ = aVar2.bits;
    pGVar26 = _profiledValueType;
LAB_0044eecc:
    pIVar23 = *pInstr;
    pVVar22 = pVStack_48;
LAB_0044efc0:
    pVVar22 = CreateDstUntransferredValue(pGVar26,(ValueType)aVar2.field_0,pIVar23,pVVar22,src2Val);
    return pVVar22;
  case And_A:
  case Or_A:
  case Xor_A:
  case Shl_A:
  case Shr_A:
  case ShrU_A:
    if ((src1Val == (Value *)0x0) ||
       (bVar8 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)this_05,(int *)&local_4c,&min2,
                           (bool)((byte)(*(uint *)&_profiledValueType->field_0xf4 >> 9) & 1)),
       this_04 = (char *)this_05, !bVar8)) {
      local_4c = 0x80000000;
      min2 = 0x7fffffff;
    }
    if ((src2Val == (Value *)0x0) ||
       (bVar8 = ValueInfo::GetIntValMinMax
                          ((ValueInfo *)this_03,&local_64,&local_60,
                           (bool)((byte)(*(uint *)&pGVar26->field_0xf4 >> 9) & 1)),
       this_04 = (char *)this_03, !bVar8)) {
      local_64 = -0x80000000;
      local_60 = 0x7fffffff;
    }
    pIVar23 = *pInstr;
    if ((int)local_4c < 0 && pIVar23->m_opcode == ShrU_A) {
      this_04 = local_40;
      IntConstantBounds::IntConstantBounds((IntConstantBounds *)this_04,local_64,local_60);
      IVar16 = IntConstantBounds::And_0x1f((IntConstantBounds *)this_04);
      if (-1 < (long)IVar16 && IVar16.lowerBound < 1) {
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue(&ValueType::AnyNumber,true);
        pIVar23 = *pInstr;
        pVVar22 = pVStack_48;
        goto LAB_0044efc0;
      }
      pIVar23 = *pInstr;
    }
    PropagateIntRangeBinary
              ((GlobOpt *)this_04,pIVar23,local_4c,min2,local_64,local_60,(int32 *)local_40,
               (int32 *)&local_74);
    pIVar23 = *pInstr;
LAB_0044e63c:
    pVVar22 = CreateDstUntransferredIntValue
                        (pGVar26,local_40._0_4_,local_74,pIVar23,pVStack_48,src2Val);
    return pVVar22;
  case CmEq_A:
  case CmGe_A:
  case CmGt_A:
  case CmLt_A:
  case CmLe_A:
  case CmNeq_A:
  case CmSrEq_A:
  case CmSrNeq_A:
    goto switchD_0044dce2_caseD_3b;
  case Conv_Num:
    bVar8 = ValueType::IsNumber((ValueType *)&this_05->byteCodeConstantValueNumbersBv);
    if (!bVar8) {
      VVar12 = ValueType::ToDefiniteAnyNumber((ValueType *)&this_05->byteCodeConstantValueNumbersBv)
      ;
      local_40._0_2_ = VVar12.field_0;
      bVar8 = true;
LAB_0044e9c4:
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)local_40,bVar8);
      pGVar26 = _profiledValueType;
      break;
    }
    goto LAB_0044eced;
  case Ld_A:
    goto switchD_0044dce2_caseD_45;
  case LdC_A_Null:
    pVVar17 = &ValueType::Null;
LAB_0044e18f:
    aVar2 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar17->field_0;
    break;
  case LdFld:
  case LdFldForTypeOf:
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
  case ScopedLdFld:
  case ScopedLdMethodFld:
switchD_0044dce2_caseD_5e:
    if (pIVar23->m_kind == InstrKindProfiled) {
      local_40._0_2_ = *(undefined2 *)&pIVar23[1]._vptr_Instr;
      bVar8 = ValueType::IsLikelyInt((ValueType *)local_40);
      if (((bVar8) && (OVar9 = IR::Opnd::GetKind((Opnd *)this_06), OVar9 == OpndKindReg)) &&
         (pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06), (pRVar20->m_sym->field_0x18 & 2) != 0))
      goto LAB_0044e4ce;
      if (this_05 == (GlobOpt *)0x0) goto LAB_0044e4b7;
      bVar8 = ValueType::IsUninitialized((ValueType *)&this_05->byteCodeConstantValueNumbersBv);
      if (!bVar8) goto LAB_0044e4ce;
      if (pGVar26->prePassLoop == (Loop *)0x0) {
LAB_0044e4a2:
        *(undefined2 *)&this_05->byteCodeConstantValueNumbersBv = local_40._0_2_;
        IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_40._0_2_);
        goto LAB_0044e4ce;
      }
      OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
      if (OVar9 == OpndKindReg) {
        pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06);
        if (((pRVar20->m_sym->field_0x18 & 1) != 0) &&
           ((pRVar20->m_sym->field_5).m_instrDef != (Instr *)0x0)) goto LAB_0044e4a2;
      }
LAB_0044e4b7:
      src1Val = NewGenericValue(pGVar26,(ValueType)local_40._0_2_,(Opnd *)this_06);
      if (src1Val == (Value *)0x0) goto LAB_0044e4ce;
    }
    else {
LAB_0044e4ce:
      src1Val = pVStack_48;
      if (pGVar26->prePassLoop != (Loop *)0x0) {
        src1Val = ValueNumberTransferDstInPrepass(pGVar26,*pInstr,pVStack_48);
      }
    }
    if (pGVar26->prePassLoop == (Loop *)0x0) {
      if (src1Val != (Value *)0x0) {
        valueInfo = src1Val->valueInfo;
        pSVar6 = valueInfo->symStore;
        if ((pSVar6 == (Sym *)0x0) || (pSVar6->m_kind != SymKindStack)) {
          OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
          if (OVar9 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            _max2 = (BVSparse<Memory::JitArenaAllocator> *)__tls_get_addr(&PTR_01548f08);
            *(undefined4 *)&_max2->head = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1336,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar8) {
LAB_0044f0ec:
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            *(undefined4 *)&_max2->head = 0;
          }
          pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06);
          SetSymStoreDirect(pGVar26,valueInfo,&pRVar20->m_sym->super_Sym);
        }
      }
      if (src1Val != pVStack_48) {
        GlobOptBlockData::SetValue(&pGVar26->currentBlock->globOptData,src1Val,(*pInstr)->m_src1);
      }
    }
    goto LAB_0044ed10;
  case StFld:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
switchD_0044dce2_caseD_70:
    bVar8 = DoFieldCopyProp(_profiledValueType);
    if (!bVar8 || src1Val == (Value *)0x0) {
      return (Value *)0x0;
    }
    if (src2Val != (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1361,"(!src2Val)","Bad src Values...");
      if (!bVar8) goto LAB_0044f0ec;
      *puVar15 = 0;
    }
    if (*(char *)((long)&(pJVar28->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_ArenaData.bigBlocks + 4) != '\x02') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1363,"(sym->IsPropertySym())","sym->IsPropertySym()");
      if (!bVar8) goto LAB_0044f0ec;
      *puVar15 = 0;
    }
    pGVar26 = _profiledValueType;
    i = *(BVIndex *)
         &(pJVar28->super_ArenaAllocator).
          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
          bigBlocks;
    uVar3 = (*pInstr)->m_opcode;
    if ((1 < (ushort)(uVar3 - 0x1f7)) &&
       (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((_profiledValueType->currentBlock->globOptData).liveFields,i),
       BVar10 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1365,
                         "(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId))"
                         ,
                         "instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId)"
                        );
      if (!bVar8) goto LAB_0044f0ec;
      *puVar15 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set((pGVar26->currentBlock->globOptData).liveFields,i);
    src1Val = pVStack_48;
    if (pGVar26->prePassLoop == (Loop *)0x0) {
      if (((ulong)this_06->byteCodeConstantValueNumbersBv & 0x4000000) == 0) goto LAB_0044ed15;
      symOpnd = IR::Opnd::AsSymOpnd((Opnd *)this_06);
      EndFieldLifetime(pGVar26,symOpnd);
      if (pGVar26->prePassLoop == (Loop *)0x0) goto LAB_0044ed15;
    }
    pIVar23 = *pInstr;
    goto LAB_0044ed02;
  default:
    if (OVar1 == CallI) {
      OVar9 = IR::Opnd::GetKind((Opnd *)this_06);
      pGVar26 = _profiledValueType;
      if (OVar9 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1439,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar8) goto LAB_0044f0ec;
        *puVar15 = 0;
      }
      pRVar20 = IR::Opnd::AsRegOpnd((Opnd *)this_06);
      aVar2 = (pRVar20->super_Opnd).m_valueType.field_0;
      break;
    }
    if (OVar1 == LdSlot) goto switchD_0044dce2_caseD_5e;
  case Neg_A:
  case ApplyArgs:
  case ProfiledDiv_A:
  case ProfiledRem_A:
  case Expo_A:
  case Conv_Obj:
  case Ld_A_ReuseLoc:
  case LdLocalObj:
  case LdInnerScope:
  case ChkUndecl:
  case EnsureNoRootFld:
  case EnsureNoRootRedeclFld:
  case ScopedEnsureNoRedeclFld:
  case InitUndecl:
  case InitUndeclLetFld:
  case InitUndeclRootLetFld:
  case InitUndeclRootConstFld:
  case InitConstSlot:
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case ArgIn0:
  case ArgOut_A:
  case ProfiledArgOut_A:
  case ArgOut_ANonVar:
  case ArgOut_Env:
  case Delete_A:
  case ProfiledLdFld:
  case LdFld_ReuseLoc:
  case ProfiledLdFld_ReuseLoc:
  case LdLocalFld:
  case ProfiledLdLocalFld:
  case LdLocalFld_ReuseLoc:
  case ProfiledLdLocalFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
  case ProfiledLdRootMethodFld:
  case ProfiledStFld:
  case ProfiledStRootFld:
  case StLocalFld:
  case ProfiledStLocalFld:
  case ProfiledStFldStrict:
  case ProfiledStRootFldStrict:
  case ProfiledInitFld:
  case InitLocalFld:
  case ProfiledInitLocalFld:
  case InitRootFld:
  case ProfiledInitRootFld:
  case DeleteFld:
  case DeleteRootFld:
  case DeleteFldStrict:
  case DeleteRootFldStrict:
switchD_0044dce2_caseD_28:
    aVar2.bits = (Type)*(undefined4 *)&this_06->byteCodeConstantValueNumbersBv;
    pGVar26 = _profiledValueType;
  }
LAB_0044ed3b:
  pVVar22 = NewGenericValue(pGVar26,(ValueType)aVar2.field_0,(Opnd *)this_06);
  return pVVar22;
}

Assistant:

Value *
GlobOpt::ValueNumberDst(IR::Instr **pInstr, Value *src1Val, Value *src2Val)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    Sym *sym;

    if (instr->CallsSetter())
    {
        return nullptr;
    }
    if (dst == nullptr)
    {
        return nullptr;
    }

    switch (dst->GetKind())
    {
    case IR::OpndKindSym:
        sym = dst->AsSymOpnd()->m_sym;
        break;

    case IR::OpndKindReg:
        sym = dst->AsRegOpnd()->m_sym;

        if (OpCodeAttr::TempNumberProducing(instr->m_opcode))
        {
            CurrentBlockData()->isTempSrc->Set(sym->m_id);
        }
        else if (OpCodeAttr::TempNumberTransfer(instr->m_opcode))
        {
            IR::Opnd *src1 = instr->GetSrc1();

            if (src1->IsRegOpnd() && CurrentBlockData()->isTempSrc->Test(src1->AsRegOpnd()->m_sym->m_id))
            {
                StackSym *src1Sym = src1->AsRegOpnd()->m_sym;
                // isTempSrc is used for marking isTempLastUse, which is used to generate AddLeftDead()
                // calls instead of the normal Add helpers. It tells the runtime that concats can use string
                // builders.
                // We need to be careful in the case where src1 points to a string builder and is getting aliased.
                // Clear the bit on src and dst of the transfer instr in this case, unless we can prove src1
                // isn't pointing at a string builder, like if it is single def and the def instr is not an Add,
                // but TempProducing.
                if (src1Sym->IsSingleDef() && src1Sym->m_instrDef->m_opcode != Js::OpCode::Add_A
                    && OpCodeAttr::TempNumberProducing(src1Sym->m_instrDef->m_opcode))
                {
                    CurrentBlockData()->isTempSrc->Set(sym->m_id);
                }
                else
                {
                    CurrentBlockData()->isTempSrc->Clear(src1->AsRegOpnd()->m_sym->m_id);
                    CurrentBlockData()->isTempSrc->Clear(sym->m_id);
                }
            }
            else
            {
                CurrentBlockData()->isTempSrc->Clear(sym->m_id);
            }
        }
        else
        {
            CurrentBlockData()->isTempSrc->Clear(sym->m_id);
        }
        break;

    case IR::OpndKindIndir:
        return nullptr;

    default:
        return nullptr;
    }

    int32 min1, max1, min2, max2, newMin, newMax;
    ValueInfo *src1ValueInfo = (src1Val ? src1Val->GetValueInfo() : nullptr);
    ValueInfo *src2ValueInfo = (src2Val ? src2Val->GetValueInfo() : nullptr);

    switch (instr->m_opcode)
    {
    case Js::OpCode::Conv_PrimStr:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsPrimitive())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Conv_Str;
        // fall-through
    case Js::OpCode::Conv_Str:
    // This opcode is commented out since we don't track regex information in GlobOpt now.
    //case Js::OpCode::Coerce_Regex:
    case Js::OpCode::Coerce_Str:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");

        // Due to fall through and the fact that Ld_A only takes one source,
        // free the other source here.
        if (instr->GetSrc2() && !(this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString()))
        {
            instr->FreeSrc2();
        }

        // fall-through
    case Js::OpCode::Coerce_StrOrRegex:
        // We don't set the ValueType of src1 for Coerce_StrOrRegex, hence skip the ASSERT
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Ld_A;
        // fall-through

    case Js::OpCode::BytecodeArgOutCapture:
    case Js::OpCode::LdAsmJsFunc:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:

        // Propagate sym attributes across the reg copy.
        if (!this->IsLoopPrePass() && instr->GetSrc1()->IsRegOpnd())
        {
            if (dst->AsRegOpnd()->m_sym->IsSingleDef())
            {
                dst->AsRegOpnd()->m_sym->CopySymAttrs(instr->GetSrc1()->AsRegOpnd()->m_sym);
            }
        }

        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(
                    profiledValueType.IsLikelyInt() &&
                    (
                        (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) ||
                        (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
                    )
                ))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass())
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }

        if (dstVal == nullptr)
        {
            // Ld_A is just transferring the value
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        break;

    case Js::OpCode::ExtendArg_A:
    {
        // SIMD_JS
        // We avoid transforming EAs to Lds to keep the IR shape consistent and avoid CSEing of EAs.
        // CSEOptimize only assigns a Value to the EA dst, and doesn't turn it to a Ld. If this happened, we shouldn't assign a new Value here.
        if (DoCSE())
        {
            IR::Opnd * currDst = instr->GetDst();
            Value * currDstVal = CurrentBlockData()->FindValue(currDst->GetStackSym());
            if (currDstVal != nullptr)
            {
                return currDstVal;
            }
        }
        break;
    }

    case Js::OpCode::CheckFixedFld:
        AssertMsg(false, "CheckFixedFld doesn't have a dst, so we should never get here");
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    // Do not transfer value type on LdRootFldForTypeOf to prevent copy-prop to LdRootFld in case the field doesn't exist since LdRootFldForTypeOf does not throw.
    // Same goes for ScopedLdFldForTypeOf as we'll end up loading the property from the root object if the property is not in the scope chain.
    //case Js::OpCode::LdRootFldForTypeOf:
    //case Js::OpCode::ScopedLdFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::LdMethodFromFlags:
    case Js::OpCode::ScopedLdFld:
        if (instr->IsProfiledInstr())
        {
            ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass() && (!dst->IsRegOpnd() || !dst->AsRegOpnd()->m_sym->IsSingleDef()))
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }
        if (dstVal == nullptr)
        {
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        if(!this->IsLoopPrePass())
        {
            // We cannot transfer value if the field hasn't been copy prop'd because we don't generate
            // an implicit call bailout between those values if we don't have "live fields" unless, we are hoisting the field.
            ValueInfo *dstValueInfo = (dstVal ? dstVal->GetValueInfo() : nullptr);

            // Update symStore if it isn't a stackSym
            if (dstVal && (!dstValueInfo->GetSymStore() || !dstValueInfo->GetSymStore()->IsStackSym()))
            {
                Assert(dst->IsRegOpnd());
                this->SetSymStoreDirect(dstValueInfo, dst->AsRegOpnd()->m_sym);
            }
            if (src1Val != dstVal)
            {
                CurrentBlockData()->SetValue(dstVal, instr->GetSrc1());
            }
        }
        break;

    case Js::OpCode::LdC_A_R8:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::ArgIn_A:
        dstVal = src1Val;
        break;

    case Js::OpCode::LdStr:
        if (src1Val == nullptr)
        {
            src1Val = NewGenericValue(ValueType::String, dst);
        }
        dstVal = src1Val;
        break;

    // LdElemUndef only assign undef if the field doesn't exist.
    // So we don't actually know what the value is, so we can't really copy prop it.
    //case Js::OpCode::LdElemUndef:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitComputedProperty:
        if (DoFieldCopyProp())
        {
            if (src1Val == nullptr)
            {
                // src1 may have no value if it's not a valid var, e.g., NULL for let/const initialization.
                // Consider creating generic values for such things.
                return nullptr;
            }
            AssertMsg(!src2Val, "Bad src Values...");

            Assert(sym->IsPropertySym());
            SymID symId = sym->m_id;
            Assert(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId));

            CurrentBlockData()->liveFields->Set(symId);
            if (!this->IsLoopPrePass() && dst->GetIsDead())
            {
                // Take the property sym out of the live fields set (with special handling for loops).
                this->EndFieldLifetime(dst->AsSymOpnd());
            }

            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return nullptr;
        }
        break;

    case Js::OpCode::Conv_Num:
        if(src1ValueInfo->IsNumber())
        {
            dstVal = ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return NewGenericValue(src1ValueInfo->Type().ToDefiniteAnyNumber().SetCanBeTaggedValue(true), dst);
        }
        break;

    case Js::OpCode::Not_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }

        this->PropagateIntRangeForNot(min1, max1, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::And_A:
    case Js::OpCode::Shl_A:
    case Js::OpCode::Shr_A:
    case Js::OpCode::ShrU_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }
        if (!src2Val || !src2ValueInfo->GetIntValMinMax(&min2, &max2, this->DoAggressiveIntTypeSpec()))
        {
            min2 = INT32_MIN;
            max2 = INT32_MAX;
        }

        if (instr->m_opcode == Js::OpCode::ShrU_A &&
            min1 < 0 &&
            IntConstantBounds(min2, max2).And_0x1f().Contains(0))
        {
            // Src1 may be too large to represent as a signed int32, and src2 may be zero.
            // Since the result can therefore be too large to represent as a signed int32,
            // include Number in the value type.
            return CreateDstUntransferredValue(
                ValueType::AnyNumber.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
        }

        this->PropagateIntRangeBinary(instr, min1, max1, min2, max2, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Incr_A:
    case Js::OpCode::Decr_A:
    {
        ValueType valueType;
        if(src1Val)
        {
            valueType = src1Val->GetValueInfo()->Type().ToDefiniteAnyNumber();
        }
        else
        {
            valueType = ValueType::Number;
        }
        return CreateDstUntransferredValue(valueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
    }

    case Js::OpCode::Add_A:
    {
        ValueType valueType;
        if (src1Val && src1ValueInfo->IsLikelyNumber() && src2Val && src2ValueInfo->IsLikelyNumber())
        {
            if(src1ValueInfo->IsLikelyInt() && src2ValueInfo->IsLikelyInt())
            {
                // When doing aggressiveIntType, just assume the result is likely going to be int
                // if both input is int.
                const bool isLikelyTagged = src1ValueInfo->IsLikelyTaggedInt() && src2ValueInfo->IsLikelyTaggedInt();
                if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    // If both of them are numbers then we can definitely say that the result is a number.
                    valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
                }
                else
                {
                    // This is only likely going to be int but can be a string as well.
                    valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
                }
            }
            else
            {
                // We can only be certain of any thing if both of them are numbers.
                // Otherwise, the result could be string.
                if (src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    if (src1ValueInfo->IsFloat() || src2ValueInfo->IsFloat())
                    {
                        // If one of them is a float, the result probably is a float instead of just int
                        // but should always be a number.
                        valueType = ValueType::Float.SetCanBeTaggedValue(true);
                    }
                    else
                    {
                        // Could be int, could be number
                        valueType = ValueType::Number.SetCanBeTaggedValue(true);
                    }
                }
                else if (src1ValueInfo->IsLikelyFloat() || src2ValueInfo->IsLikelyFloat())
                {
                    // Result is likely a float (but can be anything)
                    valueType = ValueType::Float.ToLikely();
                }
                else
                {
                    // Otherwise it is a likely int or float (but can be anything)
                    valueType = ValueType::Number.ToLikely();
                }
            }
        }
        else if((src1Val && src1ValueInfo->IsString()) || (src2Val && src2ValueInfo->IsString()))
        {
            // String + anything should always result in a string
            valueType = ValueType::String;
        }
        else if((src1Val && src1ValueInfo->IsNotString() && src1ValueInfo->IsPrimitive())
            && (src2Val && src2ValueInfo->IsNotString() && src2ValueInfo->IsPrimitive()))
        {
            // If src1 and src2 are not strings and primitive, add should yield a number.
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }
        else if((src1Val && src1ValueInfo->IsLikelyString()) || (src2Val && src2ValueInfo->IsLikelyString()))
        {
            // likelystring + anything should always result in a likelystring
            valueType = ValueType::String.ToLikely();
        }
        else
        {
            // Number or string. Could make the value a merge of Number and String, but Uninitialized is more useful at the moment.
            Assert(valueType.IsUninitialized());
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::Div_A:
        {
            ValueType divValueType = GetDivValueType(instr, src1Val, src2Val, false);
            if (divValueType.IsLikelyInt() || divValueType.IsFloat())
            {
                return CreateDstUntransferredValue(divValueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
            }
        }
        // fall-through

    case Js::OpCode::Sub_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Rem_A:
    {
        ValueType valueType;
        if( src1Val &&
            src1ValueInfo->IsLikelyInt() &&
            src2Val &&
            src2ValueInfo->IsLikelyInt() &&
            instr->m_opcode != Js::OpCode::Div_A)
        {
            const bool isLikelyTagged =
                src1ValueInfo->IsLikelyTaggedInt() && (src2ValueInfo->IsLikelyTaggedInt() || instr->m_opcode == Js::OpCode::Rem_A);
            if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
            {
                valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
            }
            else
            {
                valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
            }
        }
        else if ((src1Val && src1ValueInfo->IsLikelyFloat()) || (src2Val && src2ValueInfo->IsLikelyFloat()))
        {
            // This should ideally be NewNumberAndLikelyFloatValue since we know the result is a number but not sure if it will
            // be a float value. However, that Number/LikelyFloat value type doesn't exist currently and all the necessary
            // checks are done for float values (tagged int checks, etc.) so it's sufficient to just create a float value here.
            valueType = ValueType::Float.SetCanBeTaggedValue(true);
        }
        else
        {
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::CallI:
        Assert(dst->IsRegOpnd());
        return NewGenericValue(dst->AsRegOpnd()->GetValueType(), dst);

    case Js::OpCode::LdElemI_A:
    {
        dstVal = ValueNumberLdElemDst(pInstr, src1Val);
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if( (
                baseValueType.IsLikelyNativeArray() ||
            #ifdef _M_IX86
                (
                    !AutoSystemInfo::Data.SSE2Available() &&
                    baseValueType.IsLikelyObject() &&
                    (
                        baseValueType.GetObjectType() == ObjectType::Float32Array ||
                        baseValueType.GetObjectType() == ObjectType::Float64Array
                    )
                )
            #else
                false
            #endif
            ) &&
            instr->GetDst()->IsVar() &&
            instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;
    }

    case Js::OpCode::LdMethodElem:
        // Not worth profiling this, just assume it's likely object (should be likely function but ValueType does not track
        // functions currently, so using ObjectType::Object instead)
        dstVal = NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely(), dst);
        if(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray() && instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        dstVal = this->ValueNumberTransferDst(instr, src1Val);
        break;

    case Js::OpCode::LdLen_A:
        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                return this->NewGenericValue(profiledValueType, dst);
            }
        }
        break;

    case Js::OpCode::BrOnEmpty:
    case Js::OpCode::BrOnNotEmpty:
        Assert(dst->IsRegOpnd());
        Assert(dst->GetValueType().IsString());
        return this->NewGenericValue(ValueType::String, dst);

    case Js::OpCode::IsInst:
    case Js::OpCode::LdTrue:
    case Js::OpCode::LdFalse:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
        return this->NewGenericValue(ValueType::Boolean, dst);

    case Js::OpCode::LdUndef:
        return this->NewGenericValue(ValueType::Undefined, dst);

    case Js::OpCode::LdC_A_Null:
        return this->NewGenericValue(ValueType::Null, dst);

    case Js::OpCode::LdThis:
        if (!PHASE_OFF(Js::OptTagChecksPhase, this->func) &&
            (src1ValueInfo == nullptr || src1ValueInfo->IsUninitialized()))
        {
            return this->NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely().SetCanBeTaggedValue(false), dst);
        }
        break;

    case Js::OpCode::Typeof:
    case Js::OpCode::TypeofElem:
        return this->NewGenericValue(ValueType::String, dst);
    case Js::OpCode::InitLocalClosure:
        Assert(instr->GetDst());
        Assert(instr->GetDst()->IsRegOpnd());
        IR::RegOpnd *regOpnd = instr->GetDst()->AsRegOpnd();
        StackSym *opndStackSym = regOpnd->m_sym;
        Assert(opndStackSym != nullptr);
        ObjectSymInfo *objectSymInfo = opndStackSym->m_objectInfo;
        Assert(objectSymInfo != nullptr);
        for (PropertySym *localVarSlotList = objectSymInfo->m_propertySymList; localVarSlotList; localVarSlotList = localVarSlotList->m_nextInStackSymList)
        {
            this->slotSyms->Set(localVarSlotList->m_id);
        }
        break;
    }

    if (dstVal == nullptr)
    {
        return this->NewGenericValue(dst->GetValueType(), dst);
    }

    return CurrentBlockData()->SetValue(dstVal, dst);
}